

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O0

jpc_mqenc_t * jpc_mqenc_create(int maxctxs,jas_stream_t *out)

{
  jpc_mqenc_t *mqenc_00;
  jpc_mqstate_t **ppjVar1;
  jpc_mqenc_t *mqenc;
  jas_stream_t *out_local;
  int maxctxs_local;
  
  mqenc_00 = (jpc_mqenc_t *)jas_malloc(0x50);
  if (mqenc_00 != (jpc_mqenc_t *)0x0) {
    mqenc_00->out = out;
    mqenc_00->maxctxs = maxctxs;
    ppjVar1 = (jpc_mqstate_t **)jas_alloc2((long)mqenc_00->maxctxs,8);
    mqenc_00->ctxs = ppjVar1;
    if (ppjVar1 != (jpc_mqstate_t **)0x0) {
      mqenc_00->curctx = mqenc_00->ctxs;
      jpc_mqenc_init(mqenc_00);
      jpc_mqenc_setctxs(mqenc_00,0,(jpc_mqctx_t *)0x0);
      return mqenc_00;
    }
  }
  if (mqenc_00 != (jpc_mqenc_t *)0x0) {
    jpc_mqenc_destroy(mqenc_00);
  }
  return (jpc_mqenc_t *)0x0;
}

Assistant:

jpc_mqenc_t *jpc_mqenc_create(int maxctxs, jas_stream_t *out)
{
	jpc_mqenc_t *mqenc;

	/* Allocate memory for the MQ encoder. */
	if (!(mqenc = jas_malloc(sizeof(jpc_mqenc_t)))) {
		goto error;
	}
	mqenc->out = out;
	mqenc->maxctxs = maxctxs;

	/* Allocate memory for the per-context state information. */
	if (!(mqenc->ctxs = jas_alloc2(mqenc->maxctxs, sizeof(jpc_mqstate_t *)))) {
		goto error;
	}

	/* Set the current context to the first one. */
	mqenc->curctx = mqenc->ctxs;

	jpc_mqenc_init(mqenc);

	/* Initialize the per-context state information to something sane. */
	jpc_mqenc_setctxs(mqenc, 0, 0);

	return mqenc;

error:
	if (mqenc) {
		jpc_mqenc_destroy(mqenc);
	}
	return 0;
}